

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>
          (rule *this,not_null<pstore::transaction_base_*> args,
          not_null<const_pstore::exchange::import_ns::string_mapping_*> args_1,uint128 *args_2)

{
  context *pcVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  _Head_base<0UL,_pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_*,_false>
  local_40;
  _Head_base<0UL,_pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_*,_false>
  local_38;
  uint128 *args_local_2;
  not_null<const_pstore::exchange::import_ns::string_mapping_*> args_local_1;
  not_null<pstore::transaction_base_*> args_local;
  
  pcVar1 = (this->context_).ptr_;
  args_local_2 = args_2;
  args_local_1 = args_1;
  args_local = args;
  std::
  make_unique<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,pstore::gsl::not_null<pstore::transaction_base*>&,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>&,pstore::uint128*&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_38,
             (not_null<pstore::transaction_base_*> *)&this->context_,
             (not_null<const_pstore::exchange::import_ns::string_mapping_*> *)&args_local,
             (uint128 **)&args_local_1);
  local_40._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl =
       (object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>
        *)0x0;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
  ::
  emplace_back<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
            ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
              *)&pcVar1->stack,
             (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
              *)&local_40);
  if (local_40._M_head_impl !=
      (object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>
       *)0x0) {
    (*((local_40._M_head_impl)->super_rule)._vptr_rule[1])();
  }
  local_40._M_head_impl =
       (object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>
        *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_>_>
                 *)&local_38);
  log_top(this,true);
  uVar3 = std::_V2::system_category();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  return (error_code)(auVar2 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }